

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusxml2cpp.cpp
# Opt level: O3

QString * constRefArg(QString *__return_storage_ptr__,QByteArray *arg)

{
  ulong in_RDX;
  long in_FS_OFFSET;
  QAnyStringView QVar1;
  QStringBuilder<QLatin1String,_QLatin1String> local_38;
  undefined1 *local_18;
  undefined8 local_10;
  QString *local_8;
  
  local_8 = *(QString **)(in_FS_OFFSET + 0x28);
  local_38.a.m_data = (char *)arg;
  if ((in_RDX == 0) || (*(char *)&(arg->d).d != 'Q')) {
    local_38.b.m_size = 1;
    local_38.b.m_data = " ";
    local_38.a.m_size = in_RDX;
    QStringBuilder<QLatin1String,_QLatin1String>::convertTo<QString>
              (__return_storage_ptr__,&local_38);
  }
  else {
    local_38.b.m_size = in_RDX | 0x4000000000000000;
    local_38.a.m_size = CONCAT71(local_38.a.m_size._1_7_,1);
    local_10 = 0;
    QVar1.m_size = (size_t)"const %1 &";
    QVar1.field_0.m_data = __return_storage_ptr__;
    local_18 = (undefined1 *)&local_38;
    QtPrivate::argToQString(QVar1,0x400000000000000a,(ArgBase **)0x1);
  }
  if (*(QString **)(in_FS_OFFSET + 0x28) == local_8) {
    return *(QString **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static QString constRefArg(const QByteArray &arg)
{
    if (!arg.startsWith('Q'))
        return QLatin1StringView(arg) + " "_L1;
    else
        return "const %1 &"_L1.arg(QLatin1StringView(arg));
}